

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O0

void lyd_diff_del_meta(lyd_node *node,char *name)

{
  ly_ctx *local_30;
  lyd_attr *local_28;
  lyd_attr *attr;
  lyd_meta *meta;
  char *name_local;
  lyd_node *node_local;
  
  meta = (lyd_meta *)name;
  name_local = (char *)node;
  lyd_diff_find_meta(node,name,(lyd_meta **)&attr,&local_28);
  if (attr == (lyd_attr *)0x0) {
    if (local_28 != (lyd_attr *)0x0) {
      if (*(long *)(name_local + 8) == 0) {
        local_30 = *(ly_ctx **)(name_local + 0x78);
      }
      else {
        local_30 = (ly_ctx *)**(undefined8 **)(*(long *)(name_local + 8) + 8);
      }
      lyd_free_attr_single(local_30,local_28);
    }
  }
  else {
    lyd_free_meta_single((lyd_meta *)attr);
  }
  return;
}

Assistant:

static void
lyd_diff_del_meta(struct lyd_node *node, const char *name)
{
    struct lyd_meta *meta;
    struct lyd_attr *attr;

    lyd_diff_find_meta(node, name, &meta, &attr);

    if (meta) {
        lyd_free_meta_single(meta);
    } else if (attr) {
        lyd_free_attr_single(LYD_CTX(node), attr);
    }
}